

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

int xmlListRemoveLast(xmlListPtr l,void *data)

{
  _func_void_xmlLinkPtr *p_Var1;
  _xmlLink *p_Var2;
  _xmlLink *p_Var3;
  xmlLinkPtr pxVar4;
  int iVar5;
  
  iVar5 = 0;
  if (l != (xmlListPtr)0x0) {
    pxVar4 = xmlListLinkReverseSearch(l,data);
    iVar5 = 0;
    if (pxVar4 != (xmlLinkPtr)0x0) {
      p_Var1 = l->linkDeallocator;
      p_Var2 = pxVar4->next;
      p_Var3 = pxVar4->prev;
      p_Var3->next = p_Var2;
      p_Var2->prev = p_Var3;
      if (p_Var1 != (_func_void_xmlLinkPtr *)0x0) {
        (*p_Var1)(pxVar4);
      }
      (*xmlFree)(pxVar4);
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int
xmlListRemoveLast(xmlListPtr l, void *data)
{
    xmlLinkPtr lk;

    if (l == NULL)
        return(0);
    /*Find the last instance of this data */
    lk = xmlListLinkReverseSearch(l, data);
    if (lk != NULL) {
	xmlLinkDeallocator(l, lk);
        return 1;
    }
    return 0;
}